

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mnist.hpp
# Opt level: O3

vector<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_> *
mnist::read_images(vector<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_>
                   *__return_storage_ptr__,string *filename)

{
  char cVar1;
  runtime_error *this;
  vector<std::array<std::byte,_784UL>,_std::allocator<std::array<std::byte,_784UL>_>_> images_u8;
  path local_48;
  
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_48,filename,auto_format);
  cVar1 = std::filesystem::status(&local_48);
  pico_tree::std::filesystem::__cxx11::path::~path(&local_48);
  if ((cVar1 != -1) && (cVar1 != '\0')) {
    local_48._M_pathname._M_dataplus._M_p = (pointer)0x0;
    local_48._M_pathname._M_string_length = 0;
    local_48._M_pathname.field_2._M_allocated_capacity = 0;
    pico_tree::read_mnist_images
              (filename,(vector<std::array<std::byte,_784UL>,_std::allocator<std::array<std::byte,_784UL>_>_>
                         *)&local_48);
    cast<float,std::byte,784ul>
              (__return_storage_ptr__,
               (vector<std::array<std::byte,_784UL>,_std::allocator<std::array<std::byte,_784UL>_>_>
                *)&local_48);
    if (local_48._M_pathname._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_48._M_pathname._M_dataplus._M_p,
                      local_48._M_pathname.field_2._M_allocated_capacity -
                      (long)local_48._M_pathname._M_dataplus._M_p);
    }
    return __return_storage_ptr__;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_48._M_pathname,filename," doesn\'t exist");
  std::runtime_error::runtime_error(this,(string *)&local_48);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static std::vector<image_float> read_images(std::string const& filename) {
    if (!std::filesystem::exists(filename)) {
      throw std::runtime_error(filename + " doesn't exist");
    }

    std::vector<image_byte> images_u8;
    pico_tree::read_mnist_images(filename, images_u8);
    return cast<scalar_type>(images_u8);
  }